

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alter_table_info.cpp
# Opt level: O2

unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> __thiscall
duckdb::AlterForeignKeyInfo::Copy(AlterForeignKeyInfo *this)

{
  AlterInfo *in_RSI;
  AlterEntryData local_80;
  
  AlterInfo::GetAlterEntryData(&local_80,in_RSI);
  make_uniq_base<duckdb::AlterInfo,duckdb::AlterForeignKeyInfo,duckdb::AlterEntryData,std::__cxx11::string_const&,duckdb::vector<std::__cxx11::string,true>const&,duckdb::vector<std::__cxx11::string,true>const&,duckdb::vector<duckdb::PhysicalIndex,true>const&,duckdb::vector<duckdb::PhysicalIndex,true>const&,duckdb::AlterForeignKeyType_const&>
            ((duckdb *)this,&local_80,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RSI + 1),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              *)&in_RSI[1].catalog.field_2,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              *)&in_RSI[1].schema._M_string_length,
             (vector<duckdb::PhysicalIndex,_true> *)&in_RSI[1].name,
             (vector<duckdb::PhysicalIndex,_true> *)((long)&in_RSI[1].name.field_2 + 8),
             &in_RSI[2].super_ParseInfo.info_type);
  AlterEntryData::~AlterEntryData(&local_80);
  return (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)
         (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)this;
}

Assistant:

unique_ptr<AlterInfo> AlterForeignKeyInfo::Copy() const {
	return make_uniq_base<AlterInfo, AlterForeignKeyInfo>(GetAlterEntryData(), fk_table, pk_columns, fk_columns,
	                                                      pk_keys, fk_keys, type);
}